

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O0

void __thiscall hmi::renderer::fill_circle(renderer *this,vec2f center,float radius,color4f color)

{
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 aVar1;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 in_RDI;
  undefined8 in_XMM0_Qa;
  double dVar2;
  double dVar3;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  float angle;
  int i;
  vertex vertices [52];
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 local_538;
  vec<float,_2UL> local_530;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 local_528;
  undefined8 local_520;
  float local_518 [2];
  float local_510;
  int local_50c;
  undefined8 local_508;
  undefined8 local_500;
  undefined8 uVar4;
  size_t in_stack_fffffffffffffb10;
  vertex *in_stack_fffffffffffffb18;
  renderer *in_stack_fffffffffffffb20;
  undefined1 auStack_28 [16];
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  aVar1 = (anon_union_8_5_712f1eca_for_vec<float,_2UL>_2)&local_508;
  local_18 = in_XMM2_Qa;
  local_10 = in_XMM3_Qa;
  local_8 = in_XMM0_Qa;
  do {
    local_538 = aVar1;
    vertex::vertex((vertex *)local_538);
    aVar1.data = local_538.data + 0x18;
  } while (local_538.data + 0x18 != (float  [2])auStack_28);
  local_508 = local_8;
  local_500 = local_18;
  uVar4 = local_10;
  for (local_50c = 0; local_50c < 0x33; local_50c = local_50c + 1) {
    local_510 = ((float)local_50c * 6.2831855) / 50.0;
    local_520 = local_8;
    dVar2 = std::sin((double)(ulong)(uint)local_510);
    dVar3 = std::cos((double)(ulong)(uint)local_510);
    vec<float,_2UL>::vec(&local_530,SUB84(dVar2,0),SUB84(dVar3,0));
    local_528.data = (float  [2])operator*(local_538.data[1],in_RDI.data);
    local_518 = (float  [2])operator+(in_RDI.data,local_538.data);
    *&(((anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 *)(&local_508 + (long)(local_50c + 1) * 3))->
      x).data = local_518;
    (&local_500)[(long)(local_50c + 1) * 3] = local_18;
    *(undefined8 *)(&stack0xfffffffffffffb08 + (long)(local_50c + 1) * 0x18) = local_10;
  }
  draw(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,
       (int)((ulong)uVar4 >> 0x20));
  return;
}

Assistant:

void renderer::fill_circle(vec2f center, float radius, color4f color) {
    static constexpr int POINT_COUNT = 50;
    static constexpr float PI = 3.14159265359f;

    vertex vertices[POINT_COUNT + 2];

    vertices[0].position = center;
    vertices[0].color = color;

    for (int i = 0; i < POINT_COUNT + 1; ++i) {
      float angle = 2 * PI * i / POINT_COUNT;
      vertices[i + 1].position = center + radius * vec2f(std::sin(angle), std::cos(angle));
      vertices[i + 1].color = color;
    }

    draw(&vertices[0], POINT_COUNT + 2, GL_TRIANGLE_FAN);
  }